

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_column_reader.cpp
# Opt level: O0

void __thiscall
duckdb::ExpressionColumnReader::ExpressionColumnReader
          (ExpressionColumnReader *this,ClientContext *context,
          unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
          *child_reader_p,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_p,
          unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
          *expression_schema_p)

{
  pointer pCVar1;
  ParquetReader *reader;
  pointer pEVar2;
  LogicalType *pLVar3;
  ClientContext *in_RSI;
  undefined8 *in_RDI;
  ParquetColumnSchema *in_R8;
  vector<duckdb::LogicalType,_true> intermediate_types;
  allocator_type *in_stack_fffffffffffffeb8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffec0;
  initializer_list<duckdb::LogicalType> in_stack_fffffffffffffec8;
  LogicalType *local_110;
  ColumnReader *in_stack_ffffffffffffff50;
  LogicalType local_78 [24];
  LogicalType *local_60;
  undefined8 local_58;
  undefined1 local_50 [64];
  ClientContext *local_10;
  
  local_10 = in_RSI;
  pCVar1 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                       *)in_stack_fffffffffffffec0);
  reader = ColumnReader::Reader(pCVar1);
  unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>::
  operator*((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
             *)in_stack_fffffffffffffec0);
  ColumnReader::ColumnReader(in_stack_ffffffffffffff50,reader,in_R8);
  *in_RDI = &PTR__ExpressionColumnReader_00c033f0;
  unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>::
  unique_ptr((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
              *)0x8586e8);
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
             in_stack_fffffffffffffec0,
             (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *)
             in_stack_fffffffffffffeb8);
  duckdb::DataChunk::DataChunk((DataChunk *)(in_RDI + 0x40));
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffec0,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffeb8);
  pEVar2 = std::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>::get
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                      in_stack_fffffffffffffec0);
  duckdb::ExpressionExecutor::ExpressionExecutor
            ((ExpressionExecutor *)(in_RDI + 0x49),local_10,pEVar2);
  unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>::
  unique_ptr((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
              *)in_stack_fffffffffffffec0,
             (unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
              *)in_stack_fffffffffffffeb8);
  pCVar1 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                       *)in_stack_fffffffffffffec0);
  pLVar3 = ColumnReader::Type(pCVar1);
  duckdb::LogicalType::LogicalType(local_78,pLVar3);
  local_60 = local_78;
  local_58 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x858828);
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,in_stack_fffffffffffffeb8);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x858859);
  local_110 = (LogicalType *)&local_60;
  do {
    local_110 = local_110 + -0x18;
    duckdb::LogicalType::~LogicalType(local_110);
  } while (local_110 != local_78);
  duckdb::DataChunk::Initialize
            ((Allocator *)(in_RDI + 0x40),*(vector **)(in_RDI[2] + 0x118),(ulong)local_50);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x8588d4);
  return;
}

Assistant:

ExpressionColumnReader::ExpressionColumnReader(ClientContext &context, unique_ptr<ColumnReader> child_reader_p,
                                               unique_ptr<Expression> expr_p,
                                               unique_ptr<ParquetColumnSchema> expression_schema_p)
    : ColumnReader(child_reader_p->Reader(), *expression_schema_p), child_reader(std::move(child_reader_p)),
      expr(std::move(expr_p)), executor(context, expr.get()), expression_schema(std::move(expression_schema_p)) {
	vector<LogicalType> intermediate_types {child_reader->Type()};
	intermediate_chunk.Initialize(reader.allocator, intermediate_types);
}